

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_SignFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pSignature,
          CK_ULONG_PTR pulSignatureLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  MacAlgorithm *pMVar3;
  undefined4 extraout_var;
  AsymmetricAlgorithm *pAVar4;
  PrivateKey *pPVar5;
  size_t sVar6;
  uchar *puVar7;
  ulong __n;
  CK_RV CVar8;
  ByteString BStack_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pulSignatureLen == (CK_ULONG_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 5) {
    return 0x91;
  }
  bVar1 = Session::getAllowMultiPartOp(this_00);
  if (!bVar1) {
    return 0x91;
  }
  pMVar3 = Session::getMacOp(this_00);
  if (pMVar3 == (MacAlgorithm *)0x0) {
    pAVar4 = Session::getAsymmetricCryptoOp(this_00);
    pPVar5 = Session::getPrivateKey(this_00);
    if (pAVar4 == (AsymmetricAlgorithm *)0x0 || pPVar5 == (PrivateKey *)0x0) goto LAB_00136612;
    bVar1 = Session::getReAuthentication(this_00);
    if (bVar1) {
      Session::resetOp(this_00);
      return 0x101;
    }
    __n = (**(code **)(*(long *)pPVar5 + 0x28))(pPVar5);
    if (pSignature == (CK_BYTE_PTR)0x0) goto LAB_001366fd;
    if (*pulSignatureLen < __n) goto LAB_001365c6;
    ByteString::ByteString(&BStack_58);
    iVar2 = (*pAVar4->_vptr_AsymmetricAlgorithm[5])(pAVar4,&BStack_58);
    if ((char)iVar2 != '\0') {
      sVar6 = ByteString::size(&BStack_58);
      if (sVar6 == __n) {
        puVar7 = ByteString::byte_str(&BStack_58);
        memcpy(pSignature,puVar7,__n);
        *pulSignatureLen = __n;
        Session::resetOp(this_00);
        goto LAB_0013668a;
      }
      softHSMLog(3,"AsymSignFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x12f2,"The size of the signature differs from the size of the mechanism");
    }
    Session::resetOp(this_00);
  }
  else {
    pMVar3 = Session::getMacOp(this_00);
    if (pMVar3 == (MacAlgorithm *)0x0) {
LAB_00136612:
      Session::resetOp(this_00);
      return 0x91;
    }
    iVar2 = (*pMVar3->_vptr_MacAlgorithm[0xb])(pMVar3);
    __n = CONCAT44(extraout_var,iVar2);
    if (pSignature == (CK_BYTE_PTR)0x0) {
LAB_001366fd:
      *pulSignatureLen = __n;
      return 0;
    }
    if (*pulSignatureLen < __n) {
LAB_001365c6:
      *pulSignatureLen = __n;
      return 0x150;
    }
    ByteString::ByteString(&BStack_58);
    iVar2 = (*pMVar3->_vptr_MacAlgorithm[4])(pMVar3,&BStack_58);
    if ((char)iVar2 != '\0') {
      sVar6 = ByteString::size(&BStack_58);
      if (sVar6 == __n) {
        puVar7 = ByteString::byte_str(&BStack_58);
        memcpy(pSignature,puVar7,__n);
        *pulSignatureLen = __n;
        Session::resetOp(this_00);
LAB_0013668a:
        CVar8 = 0;
        goto LAB_00136738;
      }
      softHSMLog(3,"MacSignFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x12bb,"The size of the signature differs from the size of the mechanism");
    }
    Session::resetOp(this_00);
  }
  CVar8 = 5;
LAB_00136738:
  ByteString::~ByteString(&BStack_58);
  return CVar8;
}

Assistant:

CK_RV SoftHSM::C_SignFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pSignature, CK_ULONG_PTR pulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulSignatureLen == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_SIGN || !session->getAllowMultiPartOp())
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacSignFinal(session, pSignature, pulSignatureLen);
	else
		return AsymSignFinal(session, pSignature, pulSignatureLen);
}